

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

int __thiscall
Peers::broadcast(Peers *this,string *message,
                function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *callback
                )

{
  bool bVar1;
  reference __in;
  type *this_00;
  pointer this_01;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  PeerException *e;
  type *peer;
  type *_;
  _Self local_40;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
  *__range1;
  int sent;
  function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *callback_local;
  string *message_local;
  Peers *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
           ::begin(&this->m_peers);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
       ::end(&this->m_peers);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_40);
    if (!bVar1) break;
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>
           ::operator*(&__end1);
    std::get<0ul,std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>(__in);
    this_00 = std::
              get<1ul,std::__cxx11::string_const,std::unique_ptr<Peer,std::default_delete<Peer>>>
                        (__in);
    this_01 = std::unique_ptr<Peer,_std::default_delete<Peer>_>::operator->(this_00);
    Peer::send(this_01,(int)message,__buf,in_RCX,in_R8D);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int Peers::broadcast(const std::string &message,
                     std::function<void(const std::unique_ptr<Peer> &)> callback)
{
    int sent = 0;
    for (const auto &[_, peer] : m_peers) {
        try {
            peer->send(message);
            ++sent;
        } catch (const PeerException &e) {
            if (callback != nullptr) {
                callback(peer);
                continue;
            }
            throw e;
        }
    }
    return sent;
}